

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O0

Cut_Cut_t * Cut_NodeUnionCutsSeq(Cut_Man_t *p,Vec_Int_t *vNodes,int CutSetNum,int fFirst)

{
  uint uVar1;
  int Node_00;
  int iVar2;
  abctime aVar3;
  Cut_Cut_t *pCVar4;
  Cut_Cut_t *pCVar5;
  abctime aVar6;
  Cut_Cut_t *local_1d0;
  Cut_Cut_t *local_1c8;
  Cut_Cut_t *local_1c0;
  Cut_Cut_t *local_1b0;
  Cut_Cut_t *local_1a8;
  Cut_Cut_t *local_1a0;
  Cut_Cut_t *local_190;
  Cut_Cut_t *local_188;
  Cut_Cut_t *local_180;
  Cut_Cut_t *local_168;
  Cut_Cut_t *local_160;
  Cut_Cut_t *local_158;
  Cut_Cut_t *local_148;
  abctime clk;
  int Limit;
  int Root;
  int Node;
  int k;
  int i;
  Cut_Cut_t *pTop;
  Cut_Cut_t *pCut2;
  Cut_Cut_t *pCut;
  Cut_Cut_t *pListStart;
  Cut_Cut_t *pList;
  Cut_List_t *pSuper;
  Cut_List_t Super;
  int fFirst_local;
  int CutSetNum_local;
  Vec_Int_t *vNodes_local;
  Cut_Man_t *p_local;
  
  uVar1 = p->pParams->nVarsMax;
  Super.ppTail[0xc]._0_4_ = fFirst;
  Super.ppTail[0xc]._4_4_ = CutSetNum;
  aVar3 = Abc_Clock();
  Cut_ListStart((Cut_List_t *)&pSuper);
  Node_00 = Vec_IntEntry(vNodes,0);
  p->nNodeCuts = 1;
  pCVar4 = Cut_NodeReadCutsOld(p,Node_00);
  p->pCompareOld = pCVar4;
  if (Super.ppTail[0xc]._4_4_ < 0) {
    local_148 = (Cut_Cut_t *)0x0;
  }
  else {
    local_148 = Cut_NodeReadCutsNew(p,Node_00);
  }
  p->pCompareNew = local_148;
  _k = Cut_NodeReadCutsOld(p,Node_00);
  if (_k == (Cut_Cut_t *)0x0) {
    _k = Cut_NodeReadCutsNew(p,Node_00);
  }
  if (_k == (Cut_Cut_t *)0x0) {
    __assert_fail("pTop != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                  ,0x331,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)");
  }
  Vec_PtrClear(p->vTemp);
  for (Node = 0; iVar2 = Vec_IntSize(vNodes), Node < iVar2; Node = Node + 1) {
    iVar2 = Vec_IntEntry(vNodes,Node);
    if ((Node == 0) && (-1 < Super.ppTail[0xc]._4_4_)) {
      pListStart = Cut_NodeReadCutsTemp(p,Super.ppTail[0xc]._4_4_);
      Cut_NodeWriteCutsTemp(p,Super.ppTail[0xc]._4_4_,(Cut_Cut_t *)0x0);
    }
    else {
      pListStart = Cut_NodeReadCutsNew(p,iVar2);
      Cut_NodeWriteCutsNew(p,iVar2,(Cut_Cut_t *)0x0);
    }
    if (pListStart != (Cut_Cut_t *)0x0) {
      if ((int)Super.ppTail[0xc] == 0) {
        pCut = pListStart;
      }
      else {
        pCut = pListStart->pNext;
        pListStart->pNext = (Cut_Cut_t *)0x0;
        if (Node == 0) {
          Cut_ListAdd((Cut_List_t *)&pSuper,pListStart);
        }
        else {
          Cut_CutRecycle(p,pListStart);
        }
      }
      pCut2 = pCut;
      if (pCut == (Cut_Cut_t *)0x0) {
        local_158 = (Cut_Cut_t *)0x0;
      }
      else {
        local_158 = pCut->pNext;
      }
      pTop = local_158;
      while (pCut2 != (Cut_Cut_t *)0x0) {
        if (*(uint *)pCut2 >> 0x1c == uVar1) {
          Vec_PtrPush(p->vTemp,pCut2);
          break;
        }
        if ((p->pParams->fFilter == 0) ||
           ((iVar2 = Cut_CutFilterOne(p,(Cut_List_t *)&pSuper,pCut2), iVar2 == 0 &&
            ((p->pParams->fSeq == 0 ||
             (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
               (iVar2 = Cut_CutFilterOld(p,p->pCompareOld,pCut2), iVar2 == 0)) &&
              ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
               (iVar2 = Cut_CutFilterOld(p,p->pCompareNew,pCut2), iVar2 == 0)))))))))) {
          *(uint *)pCut2 =
               *(uint *)pCut2 & 0xff7fffff |
               (*(uint *)_k >> 0x16 & 1 ^ *(uint *)pCut2 >> 0x16 & 1) << 0x17;
          pCVar4 = pCut2->pNext;
          pCut2->pNext = (Cut_Cut_t *)0x0;
          Cut_ListAdd((Cut_List_t *)&pSuper,pCut2);
          iVar2 = p->nNodeCuts + 1;
          p->nNodeCuts = iVar2;
          if (iVar2 == p->pParams->nKeepMax) {
            if (pCVar4 == (Cut_Cut_t *)0x0) {
              local_160 = (Cut_Cut_t *)0x0;
            }
            else {
              local_160 = pCVar4->pNext;
            }
            pTop = local_160;
            pCut2 = pCVar4;
            while (Root = Node, pCut2 != (Cut_Cut_t *)0x0) {
              Cut_CutRecycle(p,pCut2);
              pCut2 = pTop;
              if (pTop == (Cut_Cut_t *)0x0) {
                local_168 = (Cut_Cut_t *)0x0;
              }
              else {
                local_168 = pTop->pNext;
              }
              pTop = local_168;
            }
            while( true ) {
              Root = Root + 1;
              iVar2 = Vec_IntSize(vNodes);
              if (iVar2 <= Root) break;
              iVar2 = Vec_IntEntry(vNodes,Root);
              Cut_NodeFreeCuts(p,iVar2);
            }
            for (Root = 0; iVar2 = Vec_PtrSize(p->vTemp), Root < iVar2; Root = Root + 1) {
              pCut2 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,Root);
              if (pCut2 == (Cut_Cut_t *)0x0) {
                local_180 = (Cut_Cut_t *)0x0;
              }
              else {
                local_180 = pCut2->pNext;
              }
              pTop = local_180;
              while (pCut2 != (Cut_Cut_t *)0x0) {
                Cut_CutRecycle(p,pCut2);
                pCut2 = pTop;
                if (pTop == (Cut_Cut_t *)0x0) {
                  local_188 = (Cut_Cut_t *)0x0;
                }
                else {
                  local_188 = pTop->pNext;
                }
                pTop = local_188;
              }
            }
            goto LAB_005b16ff;
          }
        }
        pCut2 = pTop;
        if (pTop == (Cut_Cut_t *)0x0) {
          local_190 = (Cut_Cut_t *)0x0;
        }
        else {
          local_190 = pTop->pNext;
        }
        pTop = local_190;
      }
    }
  }
  Node = 0;
  do {
    iVar2 = Vec_PtrSize(p->vTemp);
    if (iVar2 <= Node) {
LAB_005b16ff:
      pCVar4 = Cut_ListFinish((Cut_List_t *)&pSuper);
      if (Super.ppTail[0xc]._4_4_ < 0) {
        pCVar5 = Cut_NodeReadCutsNew(p,Node_00);
        if (pCVar5 != (Cut_Cut_t *)0x0) {
          __assert_fail("Cut_NodeReadCutsNew(p, Root) == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                        ,0x3b8,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)"
                       );
        }
        Cut_NodeWriteCutsNew(p,Node_00,pCVar4);
      }
      else {
        pCVar5 = Cut_NodeReadCutsTemp(p,Super.ppTail[0xc]._4_4_);
        if (pCVar5 != (Cut_Cut_t *)0x0) {
          __assert_fail("Cut_NodeReadCutsTemp(p, CutSetNum) == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                        ,0x3b3,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)"
                       );
        }
        Cut_NodeWriteCutsTemp(p,Super.ppTail[0xc]._4_4_,pCVar4);
      }
      aVar6 = Abc_Clock();
      p->timeUnion = (aVar6 - aVar3) + p->timeUnion;
      return pCVar4;
    }
    pCut2 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,Node);
    if (pCut2 == (Cut_Cut_t *)0x0) {
      local_1a0 = (Cut_Cut_t *)0x0;
    }
    else {
      local_1a0 = pCut2->pNext;
    }
    pTop = local_1a0;
    while (pCut2 != (Cut_Cut_t *)0x0) {
      if ((p->pParams->fFilter == 0) ||
         ((iVar2 = Cut_CutFilterOne(p,(Cut_List_t *)&pSuper,pCut2), iVar2 == 0 &&
          ((p->pParams->fSeq == 0 ||
           (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
             (iVar2 = Cut_CutFilterOld(p,p->pCompareOld,pCut2), iVar2 == 0)) &&
            ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
             (iVar2 = Cut_CutFilterOld(p,p->pCompareNew,pCut2), iVar2 == 0)))))))))) {
        *(uint *)pCut2 =
             *(uint *)pCut2 & 0xff7fffff |
             (*(uint *)_k >> 0x16 & 1 ^ *(uint *)pCut2 >> 0x16 & 1) << 0x17;
        pCVar4 = pCut2->pNext;
        pCut2->pNext = (Cut_Cut_t *)0x0;
        Cut_ListAdd((Cut_List_t *)&pSuper,pCut2);
        iVar2 = p->nNodeCuts + 1;
        p->nNodeCuts = iVar2;
        if (iVar2 == p->pParams->nKeepMax) {
          if (pCVar4 == (Cut_Cut_t *)0x0) {
            local_1a8 = (Cut_Cut_t *)0x0;
          }
          else {
            local_1a8 = pCVar4->pNext;
          }
          pTop = local_1a8;
          pCut2 = pCVar4;
          while (pCut2 != (Cut_Cut_t *)0x0) {
            Cut_CutRecycle(p,pCut2);
            pCut2 = pTop;
            if (pTop == (Cut_Cut_t *)0x0) {
              local_1b0 = (Cut_Cut_t *)0x0;
            }
            else {
              local_1b0 = pTop->pNext;
            }
            pTop = local_1b0;
          }
          while( true ) {
            Root = Node + 1;
            iVar2 = Vec_PtrSize(p->vTemp);
            if (iVar2 <= Root) break;
            pCut2 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,Root);
            if (pCut2 == (Cut_Cut_t *)0x0) {
              local_1c0 = (Cut_Cut_t *)0x0;
            }
            else {
              local_1c0 = pCut2->pNext;
            }
            pTop = local_1c0;
            while (Node = Root, pCut2 != (Cut_Cut_t *)0x0) {
              Cut_CutRecycle(p,pCut2);
              pCut2 = pTop;
              if (pTop == (Cut_Cut_t *)0x0) {
                local_1c8 = (Cut_Cut_t *)0x0;
              }
              else {
                local_1c8 = pTop->pNext;
              }
              pTop = local_1c8;
            }
          }
          goto LAB_005b16ff;
        }
      }
      pCut2 = pTop;
      if (pTop == (Cut_Cut_t *)0x0) {
        local_1d0 = (Cut_Cut_t *)0x0;
      }
      else {
        local_1d0 = pTop->pNext;
      }
      pTop = local_1d0;
    }
    Node = Node + 1;
  } while( true );
}

Assistant:

Cut_Cut_t * Cut_NodeUnionCutsSeq( Cut_Man_t * p, Vec_Int_t * vNodes, int CutSetNum, int fFirst )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pListStart, * pCut, * pCut2, * pTop;
    int i, k, Node, Root, Limit = p->pParams->nVarsMax;
    abctime clk = Abc_Clock();

    // start the new list
    Cut_ListStart( pSuper );

    // remember the root node to save the resulting cuts
    Root = Vec_IntEntry( vNodes, 0 );
    p->nNodeCuts = 1;

    // store the original lists for comparison
    p->pCompareOld = Cut_NodeReadCutsOld( p, Root );
    p->pCompareNew = (CutSetNum >= 0)? Cut_NodeReadCutsNew( p, Root ) : NULL;

    // get the topmost cut
    pTop = NULL;
    if ( (pTop = Cut_NodeReadCutsOld( p, Root )) == NULL )
        pTop = Cut_NodeReadCutsNew( p, Root );
    assert( pTop != NULL );

    // collect small cuts first
    Vec_PtrClear( p->vTemp );
    Vec_IntForEachEntry( vNodes, Node, i )
    {
        // get the cuts of this node
        if ( i == 0 && CutSetNum >= 0 )
        {
            pList = Cut_NodeReadCutsTemp( p, CutSetNum );
            Cut_NodeWriteCutsTemp( p, CutSetNum, NULL );
        }
        else
        {
            pList = Cut_NodeReadCutsNew( p, Node );
            Cut_NodeWriteCutsNew( p, Node, NULL );
        }
        if ( pList == NULL )
            continue;

        // process the cuts
        if ( fFirst )
        {
            // remember the starting point
            pListStart = pList->pNext;
            pList->pNext = NULL;
            // save or recycle the elementary cut
            if ( i == 0 )
                Cut_ListAdd( pSuper, pList );
            else
                Cut_CutRecycle( p, pList );
        }
        else
            pListStart = pList;

        // save all the cuts that are smaller than the limit
        Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
        {
            if ( pCut->nLeaves == (unsigned)Limit )
            {
                Vec_PtrPush( p->vTemp, pCut );
                break;
            }
            // check containment
//            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
//                continue;
            if ( p->pParams->fFilter )
            {
                if ( Cut_CutFilterOne(p, pSuper, pCut) )
                    continue;
                if ( p->pParams->fSeq )
                {
                    if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                        continue;
                    if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                        continue;
                }
            }

            // set the complemented bit by comparing the first cut with the current cut
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts of this node
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle all cuts of other nodes
                Vec_IntForEachEntryStart( vNodes, Node, k, i+1 )
                    Cut_NodeFreeCuts( p, Node );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, k )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    } 
    // collect larger cuts next
    Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, i )
    {
        Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        {
            // check containment
//            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
//                continue;
            if ( p->pParams->fFilter )
            {
                if ( Cut_CutFilterOne(p, pSuper, pCut) )
                    continue;
                if ( p->pParams->fSeq )
                {
                    if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                        continue;
                    if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                        continue;
                }
            }

            // set the complemented bit
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart   = pCut->pNext;
            pCut->pNext  = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntryStart( Cut_Cut_t *, p->vTemp, pList, k, i+1 )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    }
finish :
    // set the cuts at the node
    pList = Cut_ListFinish( pSuper );

    // set the lists at the node
//    assert( Cut_NodeReadCutsNew(p, Root) == NULL );
//    Cut_NodeWriteCutsNew( p, Root, pList );
    if ( CutSetNum >= 0 )
    {
        assert( Cut_NodeReadCutsTemp(p, CutSetNum) == NULL );
        Cut_NodeWriteCutsTemp( p, CutSetNum, pList );
    }
    else
    {
        assert( Cut_NodeReadCutsNew(p, Root) == NULL );
        Cut_NodeWriteCutsNew( p, Root, pList );
    }

p->timeUnion += Abc_Clock() - clk;
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList );
//p->timeFilter += Abc_Clock() - clk;
//    if ( fFirst )
//        p->nNodes -= vNodes->nSize - 1;
    return pList;
}